

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.y
# Opt level: O0

Element * __thiscall DocumentStorage::getTag(DocumentStorage *this,string *nm)

{
  bool bVar1;
  reference ppVar2;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>
  local_28;
  const_iterator iter;
  string *nm_local;
  DocumentStorage *this_local;
  
  iter._M_node = (_Base_ptr)nm;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>
  ::_Rb_tree_const_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>_>
             ::find(&this->tagmap,iter._M_node);
  local_28._M_node = local_30;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>_>
       ::end(&this->tagmap);
  bVar1 = std::operator!=(&local_28,&local_38);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>
             ::operator*(&local_28);
    this_local = (DocumentStorage *)ppVar2->second;
  }
  else {
    this_local = (DocumentStorage *)0x0;
  }
  return (Element *)this_local;
}

Assistant:

const Element *DocumentStorage::getTag(const string &nm) const

{ // Retrieve a registered tag by name
  map<string,const Element *>::const_iterator iter;

  iter = tagmap.find(nm);
  if (iter != tagmap.end())
    return (*iter).second;
  return (const Element *)0;
}